

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

void __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *p)

{
  size_t length;
  
  *(undefined8 *)((long)&this->m_hdr + 1) = 0;
  *(undefined8 *)((long)&this->m_length + 1) = 0;
  this->m_p = (C *)0x0;
  this->m_hdr = (BufHdr *)0x0;
  length = StringDetailsBase<char>::calcLength(p);
  attach(this,(BufHdr *)0x0,p,length,p != (C *)0x0);
  return;
}

Assistant:

StringRefBase(const C* p) {
		initialize();
		attach(NULL, p, Details::calcLength(p), p != NULL);
	}